

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<double>_>::Diagonal
          (TPZMatrix<std::complex<double>_> *this,complex<double> val)

{
  _func_int **pp_Var1;
  undefined8 *puVar2;
  long lVar3;
  int64_t col;
  long lVar4;
  int64_t row;
  long lVar5;
  undefined8 local_48 [2];
  undefined8 local_38;
  undefined8 uStack_30;
  
  if ((this->super_TPZBaseMatrix).fCol != (this->super_TPZBaseMatrix).fRow) {
    Error("Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>",(char *)0x0);
  }
  for (lVar5 = 0; lVar5 < (this->super_TPZBaseMatrix).fRow; lVar5 = lVar5 + 1) {
    for (lVar4 = 0; lVar4 < (this->super_TPZBaseMatrix).fCol; lVar4 = lVar4 + 1) {
      if (lVar5 == lVar4) {
        pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
        puVar2 = local_48;
        lVar3 = lVar5;
      }
      else {
        local_38 = 0;
        uStack_30 = 0;
        pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
        puVar2 = &local_38;
        lVar3 = lVar4;
      }
      (*pp_Var1[0x23])(this,lVar5,lVar3,puVar2);
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Diagonal(TVar val) {
    
    if ( Cols() != Rows() ) {
        Error( "Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,val):PutVal(row,col,0.);
        }
    }
}